

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 VmCallErrorHandler(jx9_vm *pVm,SyBlob *pMsg)

{
  int iVar1;
  
  SyBlobAppend(pMsg,"\n",1);
  iVar1 = (*(pVm->sVmConsumer).xConsumer)(pMsg->pBlob,pMsg->nByte,(pVm->sVmConsumer).pUserData);
  pVm->nOutputLen = pVm->nOutputLen + pMsg->nByte;
  return iVar1;
}

Assistant:

static sxi32 VmCallErrorHandler(jx9_vm *pVm, SyBlob *pMsg)
{
	jx9_output_consumer *pCons = &pVm->sVmConsumer;
	sxi32 rc = SXRET_OK;
	/* Append a new line */
#ifdef __WINNT__
	SyBlobAppend(pMsg, "\r\n", sizeof("\r\n")-1);
#else
	SyBlobAppend(pMsg, "\n", sizeof(char));
#endif
	/* Invoke the output consumer callback */
	rc = pCons->xConsumer(SyBlobData(pMsg), SyBlobLength(pMsg), pCons->pUserData);
	/* Increment output length */
	pVm->nOutputLen += SyBlobLength(pMsg);
	
	return rc;
}